

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int accum_state_var(vector_t ***var,vector_t ***mean,float32 ***dnom,vector_t **feat,uint32 n_feat,
                   uint32 *veclen,uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint local_4c;
  float32 diff;
  uint32 c;
  uint32 f;
  uint32 ci_s;
  uint32 s;
  uint32 t;
  uint32 *veclen_local;
  uint32 n_feat_local;
  vector_t **feat_local;
  float32 ***dnom_local;
  vector_t ***mean_local;
  vector_t ***var_local;
  
  for (ci_s = 0; ci_s < n_frame; ci_s = ci_s + 1) {
    if ((sseq == (uint32 *)0x0) || (ci_sseq == (uint32 *)0x0)) {
      f = 0;
      c = 0;
    }
    else {
      f = sseq[ci_s];
      c = ci_sseq[ci_s];
    }
    for (diff = 0.0; (uint)diff < n_feat; diff = (float32)((int)diff + 1)) {
      *dnom[f][(uint)diff] = (float32)((float)*dnom[f][(uint)diff] + 1.0);
      if (f != c) {
        *dnom[c][(uint)diff] = (float32)((float)*dnom[c][(uint)diff] + 1.0);
      }
      for (local_4c = 0; local_4c < veclen[(uint)diff]; local_4c = local_4c + 1) {
        (*var[f][(uint)diff])[local_4c] =
             (feat[ci_s][(uint)diff][local_4c] - (*mean[f][(uint)diff])[local_4c]) *
             (feat[ci_s][(uint)diff][local_4c] - (*mean[f][(uint)diff])[local_4c]) +
             (*var[f][(uint)diff])[local_4c];
        if (f != c) {
          (*var[c][(uint)diff])[local_4c] =
               (feat[ci_s][(uint)diff][local_4c] - (*mean[c][(uint)diff])[local_4c]) *
               (feat[ci_s][(uint)diff][local_4c] - (*mean[c][(uint)diff])[local_4c]) +
               (*var[c][(uint)diff])[local_4c];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
accum_state_var(vector_t ***var,
		vector_t ***mean,
		float32  ***dnom,
		vector_t **feat,
		uint32 n_feat,
		const uint32 *veclen,
		uint32 *sseq,
		uint32 *ci_sseq,
		uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */
    float32 diff;

    for (t = 0; t < n_frame; t++) {

	if (sseq && ci_sseq) {
	    /* get the tied state for time t */
	    s = sseq[t];
	
	    /* get the CI state as well */
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++) {
		/* only one Gaussian per state */

		diff = feat[t][f][c] - mean[s][f][0][c];
		var[s][f][0][c] += diff * diff;

		if (s != ci_s) {
		    diff = feat[t][f][c] - mean[ci_s][f][0][c];
		    var[ci_s][f][0][c] += diff * diff;
		}
	    }
	}
    }
    return 0;
}